

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_on_fork(void)

{
  uint8_t uVar1;
  uint uVar2;
  long lVar3;
  fio_data_s *pfVar4;
  long lVar5;
  long lVar6;
  
  fio_timer_lock = '\0';
  fio_data->lock = '\0';
  task_queue_normal.lock = '\0';
  task_queue_urgent.lock = '\0';
  fio_malloc_after_fork();
  fio_poll_init();
  fio_state_callback_on_fork();
  uVar2 = fio_data->capa;
  lVar6 = 0x6e;
  for (lVar5 = 0; pfVar4 = fio_data, (ulong)uVar2 << 8 != lVar5; lVar5 = lVar5 + 0x100) {
    *(undefined1 *)((long)&(fio_data->last_cycle).tv_sec + lVar6) = 0;
    *(undefined1 *)((long)pfVar4 + lVar6 + -2) = 0;
    lVar3 = *(long *)((long)pfVar4 + lVar6 + -0x16);
    if (lVar3 != 0) {
      *(undefined8 *)(lVar3 + 0x28) = 0;
      fio_force_close((ulong)*(byte *)((long)pfVar4 + lVar6 + -1) + lVar5);
    }
    lVar6 = lVar6 + 0xa8;
  }
  fio_pubsub_on_fork();
  fio_max_fd_shrink();
  uVar1 = fio_data->active;
  fio_data->active = '\0';
  fio_defer_perform();
  pfVar4 = fio_data;
  fio_data->active = uVar1;
  pfVar4->is_worker = '\x01';
  return;
}

Assistant:

static void fio_on_fork(void) {
  fio_timer_lock = FIO_LOCK_INIT;
  fio_data->lock = FIO_LOCK_INIT;
  fio_defer_on_fork();
  fio_malloc_after_fork();
  fio_poll_init();
  fio_state_callback_on_fork();

  const size_t limit = fio_data->capa;
  for (size_t i = 0; i < limit; ++i) {
    fd_data(i).sock_lock = FIO_LOCK_INIT;
    fd_data(i).protocol_lock = FIO_LOCK_INIT;
    if (fd_data(i).protocol) {
      fd_data(i).protocol->rsv = 0;
      fio_force_close(fd2uuid(i));
    }
  }

  fio_pubsub_on_fork();
  fio_max_fd_shrink();
  uint16_t old_active = fio_data->active;
  fio_data->active = 0;
  fio_defer_perform();
  fio_data->active = old_active;
  fio_data->is_worker = 1;
}